

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals
          (SPxSolverBase<double> *this,int leaveIdx,Status *leaveStat,SPxId *leaveId,
          double *leaveMax,double *leavebound,int *leaveNum,StableSum<double> *objChange)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  DataKey *pDVar4;
  Status *pSVar5;
  double *pdVar6;
  ulong *puVar7;
  double dVar8;
  undefined8 uVar9;
  DataKey *in_RCX;
  Desc *in_RDX;
  SPxSolverBase<double> *in_RDI;
  ulong *in_R8;
  double *in_R9;
  int *in_stack_00000008;
  StableSum<double> *in_stack_00000010;
  Desc *ds;
  string *in_stack_fffffffffffffe38;
  int iVar10;
  SPxLPBase<double> *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe60;
  SPxBasisBase<double> *in_stack_fffffffffffffe68;
  allocator local_c9;
  string local_c8 [36];
  SPxColId local_a4;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  SPxRowId local_40;
  Desc *local_38;
  double *local_30;
  ulong *local_28;
  DataKey *local_20;
  Desc *local_18;
  
  iVar10 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
  pDVar4 = &SPxBasisBase<double>::baseId
                      ((SPxBasisBase<double> *)in_stack_fffffffffffffe40,
                       (int)((ulong)in_stack_fffffffffffffe38 >> 0x20))->super_DataKey;
  *local_20 = *pDVar4;
  bVar1 = SPxId::isSPxRowId((SPxId *)local_20);
  if (bVar1) {
    SPxRowId::SPxRowId(&local_40,(SPxId *)local_20);
    iVar2 = SPxLPBase<double>::number
                      (in_stack_fffffffffffffe40,(SPxRowId *)in_stack_fffffffffffffe38);
    *in_stack_00000008 = iVar2;
    pSVar5 = SPxBasisBase<double>::Desc::rowStatus
                       ((Desc *)in_stack_fffffffffffffe40,
                        (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    (local_18->rowstat).thesize = *pSVar5;
    iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    switch((local_18->rowstat).thesize) {
    case 1:
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar2);
      *pSVar5 = P_FIXED;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe40,iVar10);
      *local_30 = -*pdVar6;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      dVar8 = *pdVar6;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      if (*pdVar6 <= dVar8) {
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7 ^ 0x8000000000000000;
      }
      else {
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7;
      }
      break;
    case 2:
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar2);
      *pSVar5 = P_ON_LOWER;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe40,iVar10);
      *local_30 = -*pdVar6;
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7 ^ 0x8000000000000000;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      dVar8 = *pdVar6;
      pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe40,iVar10);
      StableSum<double>::operator+=(in_stack_00000010,dVar8 * *pdVar6);
      break;
    case 4:
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar2);
      *pSVar5 = P_ON_UPPER;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe40,iVar10);
      *local_30 = -*pdVar6;
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      dVar8 = *pdVar6;
      pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe40,iVar10);
      StableSum<double>::operator+=(in_stack_00000010,dVar8 * *pdVar6);
      break;
    case 6:
      pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffe40,iVar2)
      ;
      dVar8 = *pdVar6;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      if (dVar8 < *pdVar6 || dVar8 == *pdVar6) {
        pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
        *pSVar5 = P_ON_UPPER;
        pdVar6 = (double *)infinity();
        dVar8 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        *pdVar6 = dVar8;
        pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe40,iVar10);
        *local_30 = -*pdVar6;
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        dVar8 = *pdVar6;
        pdVar6 = SPxLPBase<double>::rhs(in_stack_fffffffffffffe40,iVar10);
        StableSum<double>::operator+=(in_stack_00000010,dVar8 * *pdVar6);
      }
      else {
        pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
        *pSVar5 = P_ON_LOWER;
        pdVar6 = (double *)infinity();
        dVar8 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        *pdVar6 = -dVar8;
        pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe40,iVar10);
        *local_30 = -*pdVar6;
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7 ^ 0x8000000000000000;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        dVar8 = *pdVar6;
        pdVar6 = SPxLPBase<double>::lhs(in_stack_fffffffffffffe40,iVar10);
        StableSum<double>::operator+=(in_stack_00000010,dVar8 * *pdVar6);
      }
      break;
    case -4:
      SVar3 = SPxBasisBase<double>::dualRowStatus(in_stack_fffffffffffffe68,iVar10);
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
      *pSVar5 = SVar3;
      *local_30 = 0.0;
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7;
      break;
    default:
      local_9a = 1;
      uVar9 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"XLEAVE02 This should never happen.",&local_99);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      local_9a = 0;
      __cxa_throw(uVar9,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case -2:
      SVar3 = SPxBasisBase<double>::dualRowStatus(in_stack_fffffffffffffe68,iVar10);
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
      *pSVar5 = SVar3;
      *local_30 = 0.0;
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7 ^ 0x8000000000000000;
      break;
    case -1:
      local_75 = 1;
      uVar9 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"XLEAVE01 This should never happen.",&local_61);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      local_75 = 0;
      __cxa_throw(uVar9,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    }
    pSVar5 = SPxBasisBase<double>::Desc::rowStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[77],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE51 SPxSolverBase<R>::getLeaveVals() : row {} : {} -> {} objChange: {}\n"
               ,in_stack_00000008,(Status *)local_18,pSVar5,in_stack_00000010);
  }
  else {
    SPxColId::SPxColId(&local_a4,(SPxId *)local_20);
    iVar2 = SPxLPBase<double>::number
                      (in_stack_fffffffffffffe40,(SPxColId *)in_stack_fffffffffffffe38);
    *in_stack_00000008 = iVar2;
    pSVar5 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_fffffffffffffe40,
                        (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    (local_18->rowstat).thesize = *pSVar5;
    iVar2 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    switch((local_18->rowstat).thesize) {
    case 1:
      pSVar5 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffe40,iVar2);
      *pSVar5 = P_FIXED;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffe40,iVar10);
      *local_30 = *pdVar6;
      pdVar6 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffe40,iVar10);
      StableSum<double>::operator+=(in_stack_00000010,*pdVar6 * *local_30);
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      dVar8 = *pdVar6;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      if (*pdVar6 <= dVar8) {
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7 ^ 0x8000000000000000;
      }
      else {
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7;
      }
      break;
    case 2:
      pSVar5 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffe40,iVar2);
      *pSVar5 = P_ON_LOWER;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffe40,iVar10);
      *local_30 = *pdVar6;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      StableSum<double>::operator+=(in_stack_00000010,*pdVar6 * *local_30);
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7;
      break;
    case 4:
      pSVar5 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffe40,iVar2);
      *pSVar5 = P_ON_UPPER;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffe40,iVar10);
      *local_30 = *pdVar6;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      StableSum<double>::operator+=(in_stack_00000010,*pdVar6 * *local_30);
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7 ^ 0x8000000000000000;
      break;
    case 6:
      pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)in_stack_fffffffffffffe40,iVar2)
      ;
      dVar8 = *pdVar6;
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      if (dVar8 < *pdVar6 || dVar8 == *pdVar6) {
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7;
        pdVar6 = SPxLPBase<double>::lower(in_stack_fffffffffffffe40,iVar10);
        *local_30 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        StableSum<double>::operator+=(in_stack_00000010,*pdVar6 * *local_30);
        pdVar6 = (double *)infinity();
        dVar8 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        *pdVar6 = dVar8;
        pSVar5 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
        *pSVar5 = P_ON_LOWER;
      }
      else {
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7 ^ 0x8000000000000000;
        pdVar6 = SPxLPBase<double>::upper(in_stack_fffffffffffffe40,iVar10);
        *local_30 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        StableSum<double>::operator+=(in_stack_00000010,*pdVar6 * *local_30);
        pdVar6 = (double *)infinity();
        dVar8 = -*pdVar6;
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        *pdVar6 = dVar8;
        pSVar5 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
        *pSVar5 = P_ON_UPPER;
      }
      break;
    case -4:
      SVar3 = SPxBasisBase<double>::dualColStatus(in_stack_fffffffffffffe68,iVar10);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffe40,
                          (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      *pSVar5 = SVar3;
      *local_30 = 0.0;
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7;
      break;
    default:
      uVar9 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"XLEAVE03 This should never happen.",&local_c9);
      SPxInternalCodeException::SPxInternalCodeException
                ((SPxInternalCodeException *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      __cxa_throw(uVar9,&SPxInternalCodeException::typeinfo,
                  SPxInternalCodeException::~SPxInternalCodeException);
    case -2:
      SVar3 = SPxBasisBase<double>::dualColStatus(in_stack_fffffffffffffe68,iVar10);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus
                         ((Desc *)in_stack_fffffffffffffe40,
                          (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
      *pSVar5 = SVar3;
      *local_30 = 0.0;
      puVar7 = (ulong *)infinity();
      *local_28 = *puVar7 ^ 0x8000000000000000;
      break;
    case -1:
      SVar3 = SPxBasisBase<double>::dualColStatus(in_stack_fffffffffffffe68,iVar10);
      iVar10 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      pSVar5 = SPxBasisBase<double>::Desc::colStatus((Desc *)in_stack_fffffffffffffe40,iVar10);
      *pSVar5 = SVar3;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      dVar8 = *pdVar6;
      pdVar6 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
      if (*pdVar6 <= dVar8) {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        *local_30 = *pdVar6;
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7;
      }
      else {
        pdVar6 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffe40,iVar10);
        *local_30 = *pdVar6;
        puVar7 = (ulong *)infinity();
        *local_28 = *puVar7 ^ 0x8000000000000000;
      }
    }
    pSVar5 = SPxBasisBase<double>::Desc::colStatus(local_18,(int)((ulong)in_stack_00000008 >> 0x20))
    ;
    SPxOut::
    debug<soplex::SPxSolverBase<double>,_const_char_(&)[77],_int_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::SPxBasisBase<double>::Desc::Status_&,_soplex::StableSum<double>_&,_0>
              (in_RDI,(char (*) [77])
                      "DLEAVE52 SPxSolverBase<R>::getLeaveVals() : col {} : {} -> {} objChange: {}\n"
               ,in_stack_00000008,(Status *)local_18,pSVar5,in_stack_00000010);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals(
   int leaveIdx,
   typename SPxBasisBase<R>::Desc::Status& leaveStat,
   SPxId& leaveId,
   R& leaveMax,
   R& leavebound,
   int& leaveNum,
   StableSum<R>& objChange)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();
   leaveId = this->baseId(leaveIdx);

   if(leaveId.isSPxRowId())
   {
      leaveNum = this->number(SPxRowId(leaveId));
      leaveStat = ds.rowStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.rowStatus(leaveNum) = this->dualRowStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         throw SPxInternalCodeException("XLEAVE01 This should never happen.");

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         assert(this->lhs(leaveNum) == this->rhs(leaveNum));
         leavebound = -this->rhs(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = -this->rhs(leaveNum);                // slack !!
         leaveMax = R(infinity);
         objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = -this->lhs(leaveNum);                // slack !!
         leaveMax = R(-infinity);
         objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theLBbound[leaveIdx])
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            theLRbound[leaveNum] = R(-infinity);
            leavebound = -this->lhs(leaveNum);            // slack !!
            leaveMax = R(-infinity);
            objChange += theURbound[leaveNum] * this->lhs(leaveNum);
         }
         else
         {
            ds.rowStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            theURbound[leaveNum] = R(infinity);
            leavebound = -this->rhs(leaveNum);            // slack !!
            leaveMax = R(infinity);
            objChange += theLRbound[leaveNum] * this->rhs(leaveNum);
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE02 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE51 SPxSolverBase<R>::getLeaveVals() : row {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.rowStatus(leaveNum), objChange);
   }

   else
   {
      assert(leaveId.isSPxColId());
      leaveNum = this->number(SPxColId(leaveId));
      leaveStat = ds.colStatus(leaveNum);

      assert(isBasic(leaveStat));

      switch(leaveStat)
      {
      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);
         leavebound = 0;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == ROW);
         ds.colStatus(leaveNum) = this->dualColStatus(leaveNum);

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
         {
            leavebound = theLBbound[leaveIdx];
            leaveMax = R(-infinity);
         }
         else
         {
            leavebound = theUBbound[leaveIdx];
            leaveMax = R(infinity);
         }

         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == COLUMN);
         assert(SPxLPBase<R>::upper(leaveNum) == SPxLPBase<R>::lower(leaveNum));
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_FIXED;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += this->maxObj(leaveNum) * leavebound;

         if((*theFvec)[leaveIdx] < theLBbound[leaveIdx])
            leaveMax = R(infinity);
         else
            leaveMax = R(-infinity);

         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         leavebound = SPxLPBase<R>::upper(leaveNum);
         objChange += theUCbound[leaveNum] * leavebound;
         leaveMax = R(-infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         leavebound = SPxLPBase<R>::lower(leaveNum);
         objChange += theLCbound[leaveNum] * leavebound;
         leaveMax = R(infinity);
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == COLUMN);

         if((*theFvec)[leaveIdx] > theUBbound[leaveIdx])
         {
            leaveMax = R(-infinity);
            leavebound = SPxLPBase<R>::upper(leaveNum);
            objChange += theUCbound[leaveNum] * leavebound;
            theLCbound[leaveNum] = R(-infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         }
         else
         {
            leaveMax = R(infinity);
            leavebound = SPxLPBase<R>::lower(leaveNum);
            objChange += theLCbound[leaveNum] * leavebound;
            theUCbound[leaveNum] = R(infinity);
            ds.colStatus(leaveNum) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         }

         break;

      default:
         throw SPxInternalCodeException("XLEAVE03 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE52 SPxSolverBase<R>::getLeaveVals() : col {} : {} -> {} objChange: {}\n",
                    leaveNum, leaveStat, ds.colStatus(leaveNum), objChange);
   }
}